

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linit.c
# Opt level: O0

void luaL_openselectedlibs(lua_State *L,int load,int preload)

{
  luaL_Reg *local_28;
  luaL_Reg *lib;
  int mask;
  int preload_local;
  int load_local;
  lua_State *L_local;
  
  luaL_getsubtable(L,-0xf4628,"_PRELOAD");
  lib._4_4_ = 1;
  for (local_28 = stdlibs; local_28->name != (char *)0x0; local_28 = local_28 + 1) {
    if ((load & lib._4_4_) == 0) {
      if ((preload & lib._4_4_) != 0) {
        lua_pushcclosure(L,local_28->func,0);
        lua_setfield(L,-2,local_28->name);
      }
    }
    else {
      luaL_requiref(L,local_28->name,local_28->func,1);
      lua_settop(L,-2);
    }
    lib._4_4_ = lib._4_4_ << 1;
  }
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_openselectedlibs (lua_State *L, int load, int preload) {
  int mask;
  const luaL_Reg *lib;
  luaL_getsubtable(L, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
  for (lib = stdlibs, mask = 1; lib->name != NULL; lib++, mask <<= 1) {
    if (load & mask) {  /* selected? */
      luaL_requiref(L, lib->name, lib->func, 1);  /* require library */
      lua_pop(L, 1);  /* remove result from the stack */
    }
    else if (preload & mask) {  /* selected? */
      lua_pushcfunction(L, lib->func);
      lua_setfield(L, -2, lib->name);  /* add library to PRELOAD table */
    }
  }
  lua_assert((mask >> 1) == LUA_UTF8LIBK);
  lua_pop(L, 1);  /* remove PRELOAD table */
}